

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

bool __thiscall
slang::ast::AssertionExpr::visit<slang::ast::ConstraintExprVisitor>
          (AssertionExpr *this,ConstraintExprVisitor *visitor)

{
  byte bVar1;
  logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(this->kind) {
  case Invalid:
    bVar1 = 0;
    break;
  case Simple:
  case SequenceConcat:
  case SequenceWithMatch:
  case Unary:
  case Binary:
  case FirstMatch:
  case Clocking:
  case StrongWeak:
  case Abort:
  case Conditional:
  case Case:
  case DisableIff:
    bVar1 = visitor->failed ^ 1;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,"");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
      local_d0.field_2._M_allocated_capacity = *psVar3;
      local_d0.field_2._8_8_ = plVar2[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar3;
    }
    local_d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x199);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar2;
    plVar4 = plVar2 + 2;
    if (local_b0 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar2;
    plVar4 = plVar2 + 2;
    if (local_f0 == plVar4) {
      local_e0 = *plVar4;
      lStack_d8 = plVar2[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar4;
    }
    local_e8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (bool)bVar1;
}

Assistant:

decltype(auto) AssertionExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case AssertionExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case AssertionExprKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Simple, SimpleAssertionExpr);
        CASE(SequenceConcat, SequenceConcatExpr);
        CASE(SequenceWithMatch, SequenceWithMatchExpr);
        CASE(Unary, UnaryAssertionExpr);
        CASE(Binary, BinaryAssertionExpr);
        CASE(FirstMatch, FirstMatchAssertionExpr);
        CASE(Clocking, ClockingAssertionExpr);
        CASE(StrongWeak, StrongWeakAssertionExpr);
        CASE(Abort, AbortAssertionExpr);
        CASE(Conditional, ConditionalAssertionExpr);
        CASE(Case, CaseAssertionExpr);
        CASE(DisableIff, DisableIffAssertionExpr);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}